

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVD.hpp
# Opt level: O2

void __thiscall JAMA::SVD<double>::getU(SVD<double> *this,DynamicRectMatrix<double> *A)

{
  uint ncol;
  double **ppdVar1;
  double **ppdVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  DynamicRectMatrix<double> local_40;
  DynamicRectMatrix<double> local_30;
  
  ncol = this->m + 1;
  if (this->n < (int)ncol) {
    ncol = this->n;
  }
  OpenMD::DynamicRectMatrix<double>::DynamicRectMatrix(&local_40,this->m,ncol);
  OpenMD::DynamicRectMatrix<double>::operator=(&local_30,A);
  OpenMD::DynamicRectMatrix<double>::deallocate(&local_30);
  OpenMD::DynamicRectMatrix<double>::deallocate(&local_40);
  uVar3 = 0;
  uVar6 = (ulong)ncol;
  if ((int)ncol < 1) {
    uVar6 = uVar3;
  }
  uVar4 = (ulong)(uint)this->m;
  if (this->m < 1) {
    uVar4 = uVar3;
  }
  for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
    ppdVar1 = (this->U).data_;
    ppdVar2 = A->data_;
    for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      ppdVar2[uVar3][uVar5] = ppdVar1[uVar3][uVar5];
    }
  }
  return;
}

Assistant:

void getU(DynamicRectMatrix<Real>& A) {
      int minm = min(m + 1, n);

      A = DynamicRectMatrix<Real>(m, minm);

      for (int i = 0; i < m; i++)
        for (int j = 0; j < minm; j++)
          A(i, j) = U(i, j);
    }